

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.h
# Opt level: O3

int __thiscall
mp::
FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
::Convert2Var(FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              *this,AffineExpr *ee)

{
  double dVar1;
  size_ty sVar2;
  anon_union_8_2_43b0091d_for_VarOrConst_1 value;
  VarOrConst VVar3;
  NodeRange NVar4;
  LinearFunctionalConstraint local_c0;
  
  sVar2 = (ee->super_LinTerms).coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
          super_small_vector_data_base<double_*,_unsigned_long>.m_size;
  if (sVar2 == 1 && ee->constant_term_ == 0.0) {
    dVar1 = *(ee->super_LinTerms).coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
             super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr;
    if ((dVar1 == 1.0) && (!NAN(dVar1))) {
      return *(ee->super_LinTerms).vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
              super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr;
    }
  }
  else if (sVar2 == 0) {
    NVar4 = MakeFixedVar(this,ee->constant_term_);
    return NVar4.ir_.beg_;
  }
  LinTerms::sort_terms(&ee->super_LinTerms,true);
  gch::detail::small_vector_base<std::allocator<double>,_6U>::shrink_to_size
            ((small_vector_base<std::allocator<double>,_6U> *)ee);
  gch::detail::small_vector_base<std::allocator<int>,_6U>::shrink_to_size
            (&(ee->super_LinTerms).vars_.super_small_vector_base<std::allocator<int>,_6U>);
  LinearFunctionalConstraint::LinearFunctionalConstraint(&local_c0,ee);
  VVar3 = AssignResult2Args<mp::LinearFunctionalConstraint>(this,&local_c0);
  value = VVar3.field_1;
  if (((undefined1  [16])VVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    NVar4 = MakeFixedVar(this,value.c_);
    value = (anon_union_8_2_43b0091d_for_VarOrConst_1)NVar4.ir_;
  }
  if (6 < local_c0.affine_expr_.super_LinTerms.vars_.
          super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(local_c0.affine_expr_.super_LinTerms.vars_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    local_c0.affine_expr_.super_LinTerms.vars_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < local_c0.affine_expr_.super_LinTerms.coefs_.
          super_small_vector_base<std::allocator<double>,_6U>.m_data.
          super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
    operator_delete(local_c0.affine_expr_.super_LinTerms.coefs_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                    local_c0.affine_expr_.super_LinTerms.coefs_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p !=
      &local_c0.super_FunctionalConstraint.super_BasicConstraint.name_.field_2) {
    operator_delete(local_c0.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p
                    ,local_c0.super_FunctionalConstraint.super_BasicConstraint.name_.field_2.
                     _M_allocated_capacity + 1);
  }
  return value.var_;
}

Assistant:

int Convert2Var(AffineExpr&& ee) {
    if (ee.is_variable())
      return ee.get_representing_variable();
    if (ee.is_constant())
      return int( MakeFixedVar(ee.constant_term()) );
    ee.sort_terms();
    ee.shrink_to_fit();
    return AssignResultVar2Args(
            LinearFunctionalConstraint(std::move(ee)));
  }